

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

Color * __thiscall
scene::World::final_color(Color *__return_storage_ptr__,World *this,Ray *ray,int recursion_depth)

{
  vector<core::Intersection,_std::allocator<core::Intersection>_> xs;
  optional<const_core::Intersection> intersect;
  vector<core::Intersection,_std::allocator<core::Intersection>_> local_148;
  optional<const_core::Intersection> local_130;
  Computation local_108;
  
  intersects(&local_148,this,ray);
  core::hit(&local_130,&local_148);
  if (local_130.super__Optional_base<const_core::Intersection,_true,_true>._M_payload.
      super__Optional_payload_base<const_core::Intersection>._M_engaged == true) {
    core::Computation::Computation(&local_108,ray,(Intersection *)&local_130,&local_148);
    shade(__return_storage_ptr__,this,&local_108,recursion_depth);
  }
  else {
    image::Color::Color(__return_storage_ptr__,0.0,0.0,0.0);
  }
  if (local_148.super__Vector_base<core::Intersection,_std::allocator<core::Intersection>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<core::Intersection,_std::allocator<core::Intersection>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<core::Intersection,_std::allocator<core::Intersection>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<core::Intersection,_std::allocator<core::Intersection>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

image::Color scene::World::final_color(const core::Ray &ray, int recursion_depth) const
{
    std::vector<core::Intersection> xs = intersects(ray);
    auto intersect = core::hit(xs);
    if (intersect)
	return shade(core::Computation{ray, intersect.value(), xs}, recursion_depth);
    else
	return image::Color{0, 0, 0};
}